

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pac_expr.cc
# Opt level: O0

string * __thiscall Expr::SetFunc_abi_cxx11_(Expr *this,Output *out,Env *env)

{
  undefined8 uVar1;
  char *pcVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  Object *in_RDI;
  string parent_val;
  Env *in_stack_ffffffffffffff00;
  ID *in_stack_ffffffffffffff08;
  Expr *in_stack_ffffffffffffff10;
  string *in_stack_ffffffffffffff20;
  allocator<char> *__rhs;
  Object *pOVar3;
  int iVar4;
  undefined4 in_stack_ffffffffffffff44;
  char local_b8 [32];
  string local_98 [32];
  string local_78 [55];
  allocator<char> local_41;
  string local_40 [56];
  
  iVar4 = *(int *)((long)&in_RSI[2].field_2 + 8);
  if (iVar4 == 0) {
    set_function_abi_cxx11_(in_stack_ffffffffffffff08);
  }
  else {
    if (iVar4 != 5) {
      pOVar3 = in_RDI;
      uVar1 = __cxa_allocate_exception(0x20);
      pcVar2 = orig((Expr *)0x13548d);
      strfmt_abi_cxx11_(local_b8,"cannot generate set function for expression `%s\'",pcVar2);
      Exception::Exception((Exception *)pOVar3,in_RDI,in_stack_ffffffffffffff20);
      __cxa_throw(uVar1,&Exception::typeinfo,Exception::~Exception);
    }
    pOVar3 = in_RDI;
    EvalExpr(in_stack_ffffffffffffff10,(Output *)in_stack_ffffffffffffff08,in_stack_ffffffffffffff00
            );
    __rhs = &local_41;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_ffffffffffffff44,iVar4),(char *)in_RSI,(allocator<char> *)pOVar3);
    std::allocator<char>::~allocator(&local_41);
    std::operator+(&in_RDI->filename,(char *)__rhs);
    id((Expr *)in_RSI[3]._M_string_length);
    set_function_abi_cxx11_(in_stack_ffffffffffffff08);
    std::operator+(in_RSI,&pOVar3->filename);
    std::__cxx11::string::~string(local_98);
    std::__cxx11::string::~string(local_78);
    std::__cxx11::string::~string(local_40);
    in_RDI = pOVar3;
  }
  return &in_RDI->filename;
}

Assistant:

string Expr::SetFunc(Output* out, Env* env)
	{
	switch ( expr_type_ )
		{
		case EXPR_ID:
			return set_function(id_);
		case EXPR_MEMBER:
			{
			// Evaluate the parent
			string parent_val(operand_[0]->EvalExpr(out, env));
			return parent_val + "->" + set_function(operand_[1]->id());
			}
			break;
		default:
			throw Exception(this, strfmt("cannot generate set function "
			                             "for expression `%s'",
			                             orig()));
			break;
		}
	}